

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O2

void __thiscall wasm::RemoveUnusedBrs::visitThrow(RemoveUnusedBrs *this,Throw *curr)

{
  PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_> *this_00;
  char *pcVar1;
  char *pcVar2;
  Module *wasm;
  size_t sVar3;
  pointer pppEVar4;
  string_view name;
  uint uVar5;
  Name *pNVar6;
  bool *pbVar7;
  string_view *psVar8;
  Expression **ppEVar9;
  Expression *pEVar10;
  TupleMake *value;
  Break *pBVar11;
  ulong uVar12;
  ulong index;
  Builder local_38;
  Builder builder;
  
  pcVar1 = (curr->tag).super_IString.str._M_str;
  uVar12 = (ulong)((long)(this->catchers).
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->catchers).
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
  do {
    uVar12 = uVar12 - 1;
    if (((int)(uint)uVar12 < 0) ||
       (pEVar10 = (this->catchers).
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[(uint)uVar12 & 0x7fffffff],
       pEVar10->_id != TryTableId)) {
      return;
    }
    uVar5 = 0;
    while (index = (ulong)uVar5, index < *(ulong *)(pEVar10 + 2)) {
      pNVar6 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                         ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)&pEVar10[1].type,
                          index);
      pcVar2 = (pNVar6->super_IString).str._M_str;
      if ((pcVar2 == pcVar1) || (uVar5 = uVar5 + 1, pcVar2 == (char *)0x0)) {
        pbVar7 = ArenaVectorBase<ArenaVector<bool>,_bool>::operator[]
                           ((ArenaVectorBase<ArenaVector<bool>,_bool> *)&pEVar10[5].type,index);
        if (*pbVar7 != false) {
          return;
        }
        psVar8 = (string_view *)
                 ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)&pEVar10[3].type
                            ,index);
        this_00 = &(this->
                   super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                   ).
                   super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
        ;
        name = *psVar8;
        wasm = (this->
               super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
               ).
               super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.
               super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.
               currModule;
        local_38.wasm = wasm;
        if (pcVar2 != (char *)0x0) {
          sVar3 = (curr->operands).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements;
          if (sVar3 == 0) {
            value = (TupleMake *)0x0;
          }
          else if (sVar3 == 1) {
            ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                      operator[](&(curr->operands).
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                 ,0);
            value = (TupleMake *)*ppEVar9;
          }
          else {
            value = Builder::makeTupleMake<ArenaVector<wasm::Expression*>&>
                              (&local_38,&curr->operands);
          }
          pBVar11 = Builder::makeBreak(&local_38,(Name)name,(Expression *)value,(Expression *)0x0);
          Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::replaceCurrent
                    (&this_00->
                      super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                     ,(Expression *)pBVar11);
          return;
        }
        pBVar11 = Builder::makeBreak(&local_38,(Name)*psVar8,(Expression *)0x0,(Expression *)0x0);
        pEVar10 = getDroppedChildrenAndAppend
                            ((Expression *)curr,wasm,
                             &((this->
                               super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                               ).super_Pass.runner)->options,(Expression *)pBVar11,
                             IgnoreParentEffects);
        Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::replaceCurrent
                  (&this_00->
                    super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                   ,pEVar10);
        pppEVar4 = (this->flows).
                   super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        if ((this->flows).
            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
            super__Vector_impl_data._M_finish == pppEVar4) {
          return;
        }
        (this->flows).super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
        _M_impl.super__Vector_impl_data._M_finish = pppEVar4;
        return;
      }
    }
  } while( true );
}

Assistant:

void visitThrow(Throw* curr) {
    // If a throw will definitely be caught, and it is not a catch with a
    // reference, then it is just a branch (i.e. the code is using exceptions as
    // control flow). Turn it into a branch here so that the rest of the pass
    // can optimize it with all other branches.
    //
    // To do so, look at the closest try and see if it will catch us, and
    // proceed outwards if not.
    auto thrownTag = curr->tag;
    for (int i = catchers.size() - 1; i >= 0; i--) {
      auto* tryy = catchers[i]->dynCast<TryTable>();
      if (!tryy) {
        // We do not handle mixtures of Try and TryTable.
        return;
      }
      for (Index j = 0; j < tryy->catchTags.size(); j++) {
        auto tag = tryy->catchTags[j];
        // The tag must match, or be a catch_all.
        if (tag == thrownTag || tag.isNull()) {
          // This must not be a catch with exnref.
          if (!tryy->catchRefs[j]) {
            // Success! Create a break to replace the throw.
            auto dest = tryy->catchDests[j];
            auto& wasm = *getModule();
            Builder builder(wasm);
            if (!tag.isNull()) {
              // We are catching a specific tag, so values might be sent.
              Expression* value = nullptr;
              if (curr->operands.size() == 1) {
                value = curr->operands[0];
              } else if (curr->operands.size() > 1) {
                value = builder.makeTupleMake(curr->operands);
              }
              auto* br = builder.makeBreak(dest, value);
              replaceCurrent(br);
              return;
            }

            // catch_all: no values are sent. Drop the throw's children (while
            // ignoring parent effects: the parent is a throw, but we have
            // proven we can remove that effect).
            auto* br = builder.makeBreak(dest);
            auto* rep = getDroppedChildrenAndAppend(
              curr, wasm, getPassOptions(), br, DropMode::IgnoreParentEffects);
            replaceCurrent(rep);
            // We modified the code here and may have added a drop, etc., so
            // stop the flow (rather than re-scan it somehow). We leave
            // optimizing anything that flows out for later iterations.
            stopFlow();
          }

          // Return even if we did not optimize: we found our tag was caught.
          return;
        }
      }
    }
  }